

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall
vmips::phi::phi(phi *this,shared_ptr<vmips::VirtReg> *op0,shared_ptr<vmips::VirtReg> *op1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR_collect_register_0013e080;
  (this->op0).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (op0->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (op0->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (op0->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->op0).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->op0).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (op0->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (this->op1).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (op1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (op1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (op1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->op1).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->op1).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (op1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  return;
}

Assistant:

phi::phi(std::shared_ptr<VirtReg> op0, std::shared_ptr<VirtReg> op1) : op0(std::move(op0)), op1(std::move(op1)) {

}